

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveSymbol *primitive,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets_local;
  SmallVectorBase<const_slang::ast::Symbol_*> *results_local;
  ASTContext *context_local;
  HierarchyInstantiationSyntax *syntax_local;
  PrimitiveSymbol *primitive_local;
  
  anon_unknown_68::createPrimitives<slang::syntax::HierarchyInstantiationSyntax>
            (primitive,syntax,context,results,implicitNets);
  return;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveSymbol& primitive,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    createPrimitives(primitive, syntax, context, results, implicitNets);
}